

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O0

uint32_t get_fourcc_by_aom_encoder(aom_codec_iface_t *iface)

{
  int iVar1;
  aom_codec_iface_t *paVar2;
  aom_codec_iface_t *in_RDI;
  CodecInfo *info;
  int i;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    iVar1 = get_aom_encoder_count();
    if (iVar1 <= local_14) {
      return 0;
    }
    paVar2 = (*aom_encoders[local_14].interface)();
    if (paVar2 == in_RDI) break;
    local_14 = local_14 + 1;
  }
  return aom_encoders[local_14].fourcc;
}

Assistant:

uint32_t get_fourcc_by_aom_encoder(aom_codec_iface_t *iface) {
  for (int i = 0; i < get_aom_encoder_count(); ++i) {
    const struct CodecInfo *info = &aom_encoders[i];
    if (info->interface() == iface) {
      return info->fourcc;
    }
  }
  return 0;
}